

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormTests.cpp
# Opt level: O2

void __thiscall
MockUserCreateForm::MockUserCreateForm
          (MockUserCreateForm *this,string *firstName,string *lastName,string *email,
          string *password,bool adminStatus)

{
  (this->super_ModelForm<BaseUser>).super_Form.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ModelForm<BaseUser>).super_Form.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ModelForm<BaseUser>).super_Form.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ModelForm<BaseUser>).instance = (BaseUser *)0x0;
  (this->super_ModelForm<BaseUser>).super_Form._vptr_Form = (_func_int **)&PTR_clean_00138138;
  std::__cxx11::string::string((string *)&this->firstName,(string *)firstName);
  std::__cxx11::string::string((string *)&this->lastName,(string *)lastName);
  std::__cxx11::string::string((string *)&this->email,(string *)email);
  std::__cxx11::string::string((string *)&this->password,(string *)password);
  this->adminStatus = adminStatus;
  return;
}

Assistant:

MockUserCreateForm::MockUserCreateForm(const string &firstName, const string &lastName, const string &email,
                                       const string &password, bool adminStatus) : firstName(firstName),
                                                                                   lastName(lastName), email(email),
                                                                                   password(password),
                                                                                   adminStatus(adminStatus) {}